

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall
CConnman::SocketHandlerConnected
          (CConnman *this,vector<CNode_*,_std::allocator<CNode_*>_> *nodes,
          EventsPerSock *events_per_sock)

{
  _func_int *p_Var1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  reference ppCVar6;
  _Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true> _Var7;
  pointer pvVar8;
  type_conflict1 *ptVar9;
  type_conflict3 *ptVar10;
  element_type *peVar11;
  undefined4 extraout_var;
  NodeId NVar12;
  int *piVar13;
  undefined1 *puVar14;
  long in_FS_OFFSET;
  pair<unsigned_long,_bool> pVar15;
  int nErr;
  int nBytes;
  type_conflict3 *data_left;
  type_conflict1 *bytes_sent;
  bool errorSet;
  bool sendSet;
  bool recvSet;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  EventsPerSock *events_per_sock_local;
  vector<CNode_*,_std::allocator<CNode_*>_> *nodes_local;
  CConnman *this_local;
  bool notify;
  const_iterator it;
  CNode *pnode;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock70;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock68;
  uint8_t pchBuf [65536];
  
  puVar2 = (undefined1 *)register0x00000020;
  do {
    puVar14 = puVar2;
    *(undefined8 *)(puVar14 + -0x1000) = 0;
    puVar2 = puVar14 + -0x1000;
  } while (puVar14 + -0x1000 != pchBuf + 8);
  *(undefined8 *)(puVar14 + 0xeff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(CConnman **)(puVar14 + -0x1120) = this;
  *(vector<CNode_*,_std::allocator<CNode_*>_> **)(puVar14 + -0x1128) = nodes;
  *(EventsPerSock **)(puVar14 + -0x1130) = events_per_sock;
  *(undefined8 *)(puVar14 + -0x1188) = *(undefined8 *)(puVar14 + -0x1120);
  *(undefined8 *)(puVar14 + -0x11f0) = 0x211237;
  AssertLockNotHeldInline
            (*(char **)(puVar14 + -0x11d8),*(char **)(puVar14 + -0x11e0),*(int *)(puVar14 + -0x11e4)
             ,*(Mutex **)(puVar14 + -0x11f0));
  *(undefined8 *)(puVar14 + -0x1138) = *(undefined8 *)(puVar14 + -0x1128);
  *(undefined8 *)(puVar14 + -0x11f0) = 0x211254;
  cVar5 = std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
                    (*(vector<CNode_*,_std::allocator<CNode_*>_> **)(puVar14 + -0x11e0));
  *(CNode ***)(puVar14 + -0x1060) = cVar5._M_current;
  *(undefined8 *)(puVar14 + -0x11f0) = 0x211269;
  cVar5 = std::vector<CNode_*,_std::allocator<CNode_*>_>::end
                    (*(vector<CNode_*,_std::allocator<CNode_*>_> **)(puVar14 + -0x11e0));
  *(CNode ***)(puVar14 + -0x1068) = cVar5._M_current;
  while( true ) {
    *(undefined8 *)(puVar14 + -0x11f0) = 0x211286;
    bVar3 = __gnu_cxx::operator==<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                      (*(__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         **)(puVar14 + -0x11d8),
                       *(__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         **)(puVar14 + -0x11e0));
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    *(undefined8 *)(puVar14 + -0x11f0) = 0x21129e;
    ppCVar6 = __gnu_cxx::
              __normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
              operator*(*(__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                          **)(puVar14 + -0x11e8));
    *(CNode **)(puVar14 + -0x1070) = *ppCVar6;
    *(undefined8 *)(puVar14 + -0x11f0) = 0x2112ba;
    bVar3 = CThreadInterrupt::operator_cast_to_bool(*(CThreadInterrupt **)(puVar14 + -0x11e8));
    if (bVar3) break;
    puVar14[-0x1139] = 0;
    puVar14[-0x113a] = 0;
    puVar14[-0x113b] = 0;
    *(undefined8 *)(puVar14 + -0x11f0) = 0x2112f1;
    MaybeCheckNotHeld(*(Mutex **)(puVar14 + -0x11e8));
    *(undefined8 *)(puVar14 + -0x11f0) = 0x211318;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (*(UniqueLock<AnnotatedMixin<std::mutex>_> **)(puVar14 + -0x11a8),
               *(AnnotatedMixin<std::mutex> **)(puVar14 + -0x11b0),*(char **)(puVar14 + -0x11b8),
               *(char **)(puVar14 + -0x11c0),*(int *)(puVar14 + -0x11c4),(bool)puVar14[-0x11c5]);
    *(undefined8 *)(puVar14 + -0x11f0) = 0x211329;
    bVar3 = std::__shared_ptr::operator_cast_to_bool
                      (*(__shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2> **)(puVar14 + -0x11e8));
    if (bVar3) {
      *(undefined8 *)(puVar14 + -0x11a0) = *(undefined8 *)(puVar14 + -0x1130);
      *(undefined1 **)(puVar14 + -0x1198) = puVar14 + -0x1088;
      *(undefined8 *)(puVar14 + -0x11f0) = 0x211368;
      std::shared_ptr<Sock_const>::shared_ptr<Sock,void>
                (*(shared_ptr<const_Sock> **)(puVar14 + -0x11e8),
                 *(shared_ptr<Sock> **)(puVar14 + -0x11f0));
      *(undefined8 *)(puVar14 + -0x11f0) = 0x211377;
      _Var7._M_cur = (__node_type *)
                     std::
                     unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                     ::find(*(unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                              **)(puVar14 + -0x11e0),*(key_type **)(puVar14 + -0x11e8));
      ((_Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true> *)
      (puVar14 + -0x1190))->_M_cur = _Var7._M_cur;
      *(undefined8 *)(puVar14 + -0x1078) = *(undefined8 *)(puVar14 + -0x1190);
      *(undefined8 *)(puVar14 + -0x11f0) = 0x211398;
      std::shared_ptr<const_Sock>::~shared_ptr(*(shared_ptr<const_Sock> **)(puVar14 + -0x11e8));
      *(undefined8 *)(puVar14 + -0x11f0) = 0x2113a5;
      _Var7._M_cur = (__node_type *)
                     std::
                     unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                     ::end(*(unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                             **)(puVar14 + -0x11e0));
      ((_Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true> *)
      (puVar14 + -0x1090))->_M_cur = _Var7._M_cur;
      *(undefined8 *)(puVar14 + -0x11f0) = 0x2113c2;
      bVar3 = std::__detail::operator==
                        (*(_Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
                           **)(puVar14 + -0x11d8),
                         *(_Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
                           **)(puVar14 + -0x11e0));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        *(undefined8 *)(puVar14 + -0x11f0) = 0x2113da;
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                 ::operator->(*(_Node_const_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                                **)(puVar14 + -0x11e8));
        puVar14[-0x1139] = ((pvVar8->second).occurred & 1) != 0;
        *(undefined8 *)(puVar14 + -0x11f0) = 0x2113fd;
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                 ::operator->(*(_Node_const_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                                **)(puVar14 + -0x11e8));
        puVar14[-0x113a] = ((pvVar8->second).occurred & 2) != 0;
        *(undefined8 *)(puVar14 + -0x11f0) = 0x211420;
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                 ::operator->(*(_Node_const_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                                **)(puVar14 + -0x11e8));
        puVar14[-0x113b] = ((pvVar8->second).occurred & 4) != 0;
      }
      *(undefined4 *)(puVar14 + -0x1140) = 0;
    }
    else {
      *(undefined4 *)(puVar14 + -0x1140) = 3;
    }
    *(undefined8 *)(puVar14 + -0x11f0) = 0x211487;
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              (*(UniqueLock<AnnotatedMixin<std::mutex>_> **)(puVar14 + -0x11e8));
    if (*(int *)(puVar14 + -0x1140) == 0) {
      if ((puVar14[-0x113a] & 1) != 0) {
        *(undefined8 *)(puVar14 + -0x11f0) = 0x2114b8;
        MaybeCheckNotHeld(*(Mutex **)(puVar14 + -0x11e8));
        *(undefined1 **)(puVar14 + -0x10a0) = puVar14 + -0x1070;
        *(undefined8 *)(puVar14 + -0x1098) = *(undefined8 *)(puVar14 + -0x1188);
        *(undefined8 *)(puVar14 + -0x11f0) = 0x2114e2;
        pVar15 = SocketHandlerConnected::anon_class_16_2_fdbd8d23::operator()
                           (*(anon_class_16_2_fdbd8d23 **)(puVar14 + -0x11a8));
        puVar14[-0x10a8] = pVar15.second;
        *(unsigned_long *)(puVar14 + -0x10b0) = pVar15.first;
        *(undefined8 *)(puVar14 + -0x1048) = *(undefined8 *)(puVar14 + -0x10b0);
        puVar14[-0x1040] = puVar14[-0x10a8];
        *(undefined8 *)(puVar14 + -0x11f0) = 0x21151c;
        ptVar9 = std::get<0ul,unsigned_long,bool>
                           (*(pair<unsigned_long,_bool> **)(puVar14 + -0x11e8));
        *(type_conflict1 **)(puVar14 + -0x1158) = ptVar9;
        *(undefined8 *)(puVar14 + -0x11f0) = 0x211531;
        ptVar10 = std::get<1ul,unsigned_long,bool>
                            (*(pair<unsigned_long,_bool> **)(puVar14 + -0x11e8));
        *(type_conflict3 **)(puVar14 + -0x1160) = ptVar10;
        if (**(long **)(puVar14 + -0x1158) != 0) {
          *(undefined8 *)(puVar14 + -0x11f0) = 0x21155c;
          RecordBytesSent(*(CConnman **)(puVar14 + -0x11a0),*(uint64_t *)(puVar14 + -0x11a8));
          if ((**(byte **)(puVar14 + -0x1160) & 1) != 0) {
            puVar14[-0x1139] = 0;
          }
        }
      }
      if (((puVar14[-0x1139] & 1) != 0) || ((puVar14[-0x113b] & 1) != 0)) {
        *(undefined4 *)(puVar14 + -0x1164) = 0;
        *(undefined8 *)(puVar14 + -0x11f0) = 0x2115ac;
        MaybeCheckNotHeld(*(Mutex **)(puVar14 + -0x11e8));
        *(undefined8 *)(puVar14 + -0x11f0) = 0x2115d3;
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  (*(UniqueLock<AnnotatedMixin<std::mutex>_> **)(puVar14 + -0x11a8),
                   *(AnnotatedMixin<std::mutex> **)(puVar14 + -0x11b0),*(char **)(puVar14 + -0x11b8)
                   ,*(char **)(puVar14 + -0x11c0),*(int *)(puVar14 + -0x11c4),(bool)puVar14[-0x11c5]
                  );
        *(undefined8 *)(puVar14 + -0x11f0) = 0x2115e4;
        bVar3 = std::__shared_ptr::operator_cast_to_bool
                          (*(__shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2> **)(puVar14 + -0x11e8));
        if (bVar3) {
          *(undefined8 *)(puVar14 + -0x11f0) = 0x211606;
          peVar11 = std::__shared_ptr_access<Sock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(*(__shared_ptr_access<Sock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 **)(puVar14 + -0x11e8));
          p_Var1 = peVar11->_vptr_Sock[4];
          *(undefined8 *)(puVar14 + -0x11f0) = 0x211624;
          iVar4 = (*p_Var1)(peVar11,puVar14 + -0x1008,0x10000,0x40);
          *(ulong *)(puVar14 + -0x11a8) = CONCAT44(extraout_var,iVar4);
          *(int *)(puVar14 + -0x1164) = (int)*(undefined8 *)(puVar14 + -0x11a8);
          *(undefined4 *)(puVar14 + -0x1140) = 0;
        }
        else {
          *(undefined4 *)(puVar14 + -0x1140) = 3;
        }
        *(undefined8 *)(puVar14 + -0x11f0) = 0x21164f;
        UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                  (*(UniqueLock<AnnotatedMixin<std::mutex>_> **)(puVar14 + -0x11e8));
        if (*(int *)(puVar14 + -0x1140) != 0) goto LAB_002119e0;
        if (*(int *)(puVar14 + -0x1164) < 1) {
          if (*(int *)(puVar14 + -0x1164) == 0) {
            *(undefined8 *)(puVar14 + -0x11f0) = 0x21175a;
            bVar3 = std::atomic::operator_cast_to_bool(*(atomic<bool> **)(puVar14 + -0x11d0));
            if (!bVar3) {
              *(undefined8 *)(puVar14 + -0x11f0) = 0x211773;
              bVar3 = ::LogAcceptCategory(*(LogFlags *)(puVar14 + -0x11e8),
                                          *(Level *)(puVar14 + -0x11ec));
              if (bVar3) {
                *(undefined8 *)(puVar14 + -0x11f0) = 0x211790;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (*(basic_string_view<char,_std::char_traits<char>_> **)(puVar14 + -0x11c8)
                           ,*(char **)(puVar14 + -0x11d0));
                *(undefined8 *)(puVar14 + -0x11f0) = 0x2117a4;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (*(basic_string_view<char,_std::char_traits<char>_> **)(puVar14 + -0x11c8)
                           ,*(char **)(puVar14 + -0x11d0));
                *(char **)(puVar14 + -0x1170) = "socket closed for peer=%d\n";
                *(undefined8 *)(puVar14 + -0x11f0) = 0x2117bd;
                NVar12 = CNode::GetId(*(CNode **)(puVar14 + -0x11e8));
                *(NodeId *)(puVar14 + -0x10f0) = NVar12;
                *(undefined4 *)(puVar14 + -0x11e8) = 1;
                *(undefined8 *)(puVar14 + -0x11e0) = *(undefined8 *)(puVar14 + -0x1170);
                *(undefined1 **)(puVar14 + -0x11d8) = puVar14 + -0x10f0;
                *(undefined8 *)(puVar14 + -0x11f0) = 0x211814;
                LogPrintFormatInternal<long>
                          (*(string_view *)(puVar14 + -0x1120),*(string_view *)(puVar14 + -0x1130),
                           *(int *)(puVar14 + -0x1174),*(LogFlags *)(puVar14 + -0x1180),
                           *(Level *)(puVar14 + -0x1040),
                           (ConstevalFormatString<1U>)*(char **)(puVar14 + -0x1138),
                           *(long **)(puVar14 + -0x1030));
              }
            }
            *(undefined8 *)(puVar14 + -0x11f0) = 0x211825;
            CNode::CloseSocketDisconnect(*(CNode **)(puVar14 + -0x11a8));
          }
          else if (*(int *)(puVar14 + -0x1164) < 0) {
            *(undefined8 *)(puVar14 + -0x11f0) = 0x21183d;
            piVar13 = __errno_location();
            *(int *)(puVar14 + -0x1174) = *piVar13;
            if ((((*(int *)(puVar14 + -0x1174) != 0xb) && (*(int *)(puVar14 + -0x1174) != 0x5a)) &&
                (*(int *)(puVar14 + -0x1174) != 4)) && (*(int *)(puVar14 + -0x1174) != 0x73)) {
              *(undefined8 *)(puVar14 + -0x11f0) = 0x211883;
              bVar3 = std::atomic::operator_cast_to_bool(*(atomic<bool> **)(puVar14 + -0x11d0));
              if (!bVar3) {
                *(undefined8 *)(puVar14 + -0x11f0) = 0x21189c;
                bVar3 = ::LogAcceptCategory(*(LogFlags *)(puVar14 + -0x11e8),
                                            *(Level *)(puVar14 + -0x11ec));
                if (bVar3) {
                  *(undefined8 *)(puVar14 + -0x11f0) = 0x2118b9;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (*(basic_string_view<char,_std::char_traits<char>_> **)
                              (puVar14 + -0x11c8),*(char **)(puVar14 + -0x11d0));
                  *(undefined8 *)(puVar14 + -0x11f0) = 0x2118cd;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (*(basic_string_view<char,_std::char_traits<char>_> **)
                              (puVar14 + -0x11c8),*(char **)(puVar14 + -0x11d0));
                  *(char **)(puVar14 + -0x1180) = "socket recv error for peer=%d: %s\n";
                  *(undefined8 *)(puVar14 + -0x11f0) = 0x2118e6;
                  NVar12 = CNode::GetId(*(CNode **)(puVar14 + -0x11e8));
                  *(NodeId *)(puVar14 + -0x1118) = NVar12;
                  *(undefined1 **)(puVar14 + -0x11b8) = puVar14 + -0x1028;
                  *(undefined8 *)(puVar14 + -0x11f0) = 0x211904;
                  NetworkErrorString_abi_cxx11_(*(int *)(puVar14 + -0x11dc));
                  *(undefined8 *)(puVar14 + -0x11d0) = *(undefined8 *)(puVar14 + -0x11b8);
                  *(undefined1 **)(puVar14 + -0x11d8) = puVar14 + -0x1118;
                  *(undefined8 *)(puVar14 + -0x11e0) = *(undefined8 *)(puVar14 + -0x1180);
                  *(undefined4 *)(puVar14 + -0x11e8) = 1;
                  *(undefined8 *)(puVar14 + -0x11f0) = 0x21195c;
                  LogPrintFormatInternal<long,std::__cxx11::string>
                            (*(string_view *)(puVar14 + -0x1120),*(string_view *)(puVar14 + -0x1130)
                             ,*(int *)(puVar14 + -0x1174),*(LogFlags *)(puVar14 + -0x1180),
                             *(Level *)(puVar14 + -0x1040),
                             (ConstevalFormatString<2U>)*(char **)(puVar14 + -0x1138),
                             *(long **)(puVar14 + -0x1030),
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (puVar14 + -0x1028));
                  *(undefined8 *)(puVar14 + -0x11f0) = 0x21196b;
                  std::__cxx11::string::~string
                            (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (puVar14 + -0x11e8));
                }
              }
              *(undefined8 *)(puVar14 + -0x11f0) = 0x2119a5;
              CNode::CloseSocketDisconnect(*(CNode **)(puVar14 + -0x11a8));
            }
          }
        }
        else {
          puVar14[-0x10b1] = 0;
          *(undefined8 *)(puVar14 + -0x11b0) = *(undefined8 *)(puVar14 + -0x1070);
          *(undefined8 *)(puVar14 + -0x11f0) = 0x2116a1;
          Span<const_unsigned_char>::Span<unsigned_char,_0>
                    (*(Span<const_unsigned_char> **)(puVar14 + -0x11d8),
                     *(uchar **)(puVar14 + -0x11e0),*(size_t *)(puVar14 + -0x11e8));
          *(undefined8 *)(puVar14 + -0x11f0) = 0x2116c3;
          bVar3 = CNode::ReceiveMsgBytes
                            (*(CNode **)(puVar14 + -0x1168),
                             *(Span<const_unsigned_char> *)(puVar14 + -0x1120),
                             *(bool **)(puVar14 + -0x1170));
          if (!bVar3) {
            *(undefined8 *)(puVar14 + -0x11f0) = 0x2116d4;
            CNode::CloseSocketDisconnect(*(CNode **)(puVar14 + -0x11a8));
          }
          *(undefined8 *)(puVar14 + -0x11f0) = 0x211712;
          RecordBytesRecv(*(CConnman **)(puVar14 + -0x11e8),*(uint64_t *)(puVar14 + -0x11f0));
          if ((puVar14[-0x10b1] & 1) != 0) {
            *(undefined8 *)(puVar14 + -0x11f0) = 0x211729;
            CNode::MarkReceivedMsgsForProcessing(*(CNode **)(puVar14 + -0x11b8));
            *(undefined8 *)(puVar14 + -0x11f0) = 0x211733;
            WakeMessageHandler(*(CConnman **)(puVar14 + -0x11d8));
          }
        }
      }
      *(undefined8 *)(puVar14 + -0x11f0) = 0x2119bf;
      bVar3 = InactivityCheck(*(CConnman **)(puVar14 + -0x1158),*(CNode **)(puVar14 + -0x1160));
      if (bVar3) {
        *(undefined8 *)(puVar14 + -0x11f0) = 0x2119de;
        std::atomic<bool>::operator=(*(atomic<bool> **)(puVar14 + -0x11e8),(bool)puVar14[-0x11e9]);
      }
    }
LAB_002119e0:
    *(undefined8 *)(puVar14 + -0x11f0) = 0x2119ed;
    __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++(*(__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                 **)(puVar14 + -0x11e8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar14 + 0xeff8)) {
    *(undefined **)(puVar14 + -0x11f0) = &UNK_00211a42;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::SocketHandlerConnected(const std::vector<CNode*>& nodes,
                                      const Sock::EventsPerSock& events_per_sock)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);

    for (CNode* pnode : nodes) {
        if (interruptNet)
            return;

        //
        // Receive
        //
        bool recvSet = false;
        bool sendSet = false;
        bool errorSet = false;
        {
            LOCK(pnode->m_sock_mutex);
            if (!pnode->m_sock) {
                continue;
            }
            const auto it = events_per_sock.find(pnode->m_sock);
            if (it != events_per_sock.end()) {
                recvSet = it->second.occurred & Sock::RECV;
                sendSet = it->second.occurred & Sock::SEND;
                errorSet = it->second.occurred & Sock::ERR;
            }
        }

        if (sendSet) {
            // Send data
            auto [bytes_sent, data_left] = WITH_LOCK(pnode->cs_vSend, return SocketSendData(*pnode));
            if (bytes_sent) {
                RecordBytesSent(bytes_sent);

                // If both receiving and (non-optimistic) sending were possible, we first attempt
                // sending. If that succeeds, but does not fully drain the send queue, do not
                // attempt to receive. This avoids needlessly queueing data if the remote peer
                // is slow at receiving data, by means of TCP flow control. We only do this when
                // sending actually succeeded to make sure progress is always made; otherwise a
                // deadlock would be possible when both sides have data to send, but neither is
                // receiving.
                if (data_left) recvSet = false;
            }
        }

        if (recvSet || errorSet)
        {
            // typical socket buffer is 8K-64K
            uint8_t pchBuf[0x10000];
            int nBytes = 0;
            {
                LOCK(pnode->m_sock_mutex);
                if (!pnode->m_sock) {
                    continue;
                }
                nBytes = pnode->m_sock->Recv(pchBuf, sizeof(pchBuf), MSG_DONTWAIT);
            }
            if (nBytes > 0)
            {
                bool notify = false;
                if (!pnode->ReceiveMsgBytes({pchBuf, (size_t)nBytes}, notify)) {
                    pnode->CloseSocketDisconnect();
                }
                RecordBytesRecv(nBytes);
                if (notify) {
                    pnode->MarkReceivedMsgsForProcessing();
                    WakeMessageHandler();
                }
            }
            else if (nBytes == 0)
            {
                // socket closed gracefully
                if (!pnode->fDisconnect) {
                    LogDebug(BCLog::NET, "socket closed for peer=%d\n", pnode->GetId());
                }
                pnode->CloseSocketDisconnect();
            }
            else if (nBytes < 0)
            {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS)
                {
                    if (!pnode->fDisconnect) {
                        LogDebug(BCLog::NET, "socket recv error for peer=%d: %s\n", pnode->GetId(), NetworkErrorString(nErr));
                    }
                    pnode->CloseSocketDisconnect();
                }
            }
        }

        if (InactivityCheck(*pnode)) pnode->fDisconnect = true;
    }
}